

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsShare3(octet *si,size_t count,size_t threshold,size_t len,octet *s)

{
  u32 *h;
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  size_t sVar4;
  blob_t stack;
  u32 *key_;
  
  eVar2 = 0x6d;
  if (((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) &&
     (bVar1 = memIsValid(s,len), bVar1 != 0)) {
    sVar3 = beltCTR_keep();
    sVar4 = beltCompr_deep();
    if (sVar4 < sVar3) {
      sVar3 = beltCTR_keep();
    }
    else {
      sVar3 = beltCompr_deep();
    }
    stack = blobCreate(sVar3 + 0x60);
    if (stack == (blob_t)0x0) {
      eVar2 = 0x6e;
    }
    else {
      sVar3 = beltCTR_keep();
      sVar4 = beltCompr_deep();
      if (sVar4 < sVar3) {
        sVar3 = beltCTR_keep();
      }
      else {
        sVar3 = beltCompr_deep();
      }
      h = (u32 *)(sVar3 + (long)stack);
      key_ = (u32 *)((long)stack + sVar3 + 0x20);
      beltKeyExpand2(key_,s,len);
      memCopy((void *)((long)stack + sVar3 + 0x40),key_,0x20);
      memNeg(key_,0x20);
      beltCompr(h,key_,stack);
      u32To(h,0x20,h);
      *(int *)((long)stack + sVar3 + 0x30) = (int)count;
      *(int *)((long)stack + sVar3 + 0x34) = (int)threshold;
      u32To(key_,4,(u32 *)((long)stack + sVar3 + 0x30));
      u32To((void *)((long)stack + sVar3 + 0x24),4,(u32 *)((long)stack + sVar3 + 0x34));
      memSet((void *)((long)stack + sVar3 + 0x28),'\0',8);
      beltCTRStart(stack,(octet *)h,0x20,(octet *)key_);
      eVar2 = belsShare2(si,count,threshold,len,s,belsGenkStepR,stack);
      blobClose(stack);
    }
  }
  return eVar2;
}

Assistant:

err_t belsShare3(octet si[], size_t count, size_t threshold, size_t len,
	const octet s[])
{
	void* state;
	err_t code;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || !memIsValid(s, len)) 
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(belsGenk_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// запустить генератор
	belsGenkStart(state, s, count, threshold, len);
	// разделить секрет
	code = belsShare2(si, count, threshold, len, s, belsGenkStepR, state);
	// завершение
	blobClose(state);
	return code;
}